

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void switch_mode(CPUARMState_conflict *env,int mode)

{
  uint32_t uVar1;
  uint mode_00;
  int iVar2;
  int i;
  int old_mode;
  int mode_local;
  CPUARMState_conflict *env_local;
  
  mode_00 = env->uncached_cpsr & 0x1f;
  if (mode != mode_00) {
    if (mode_00 == 0x11) {
      *(undefined8 *)env->fiq_regs = *(undefined8 *)(env->regs + 8);
      *(undefined8 *)(env->fiq_regs + 2) = *(undefined8 *)(env->regs + 10);
      env->fiq_regs[4] = env->regs[0xc];
      *(undefined8 *)(env->regs + 8) = *(undefined8 *)env->usr_regs;
      *(undefined8 *)(env->regs + 10) = *(undefined8 *)(env->usr_regs + 2);
      env->regs[0xc] = env->usr_regs[4];
    }
    else if (mode == 0x11) {
      *(undefined8 *)env->usr_regs = *(undefined8 *)(env->regs + 8);
      *(undefined8 *)(env->usr_regs + 2) = *(undefined8 *)(env->regs + 10);
      env->usr_regs[4] = env->regs[0xc];
      *(undefined8 *)(env->regs + 8) = *(undefined8 *)env->fiq_regs;
      *(undefined8 *)(env->regs + 10) = *(undefined8 *)(env->fiq_regs + 2);
      env->regs[0xc] = env->fiq_regs[4];
    }
    iVar2 = bank_number(mode_00);
    env->banked_r13[iVar2] = env->regs[0xd];
    env->banked_spsr[iVar2] = (ulong)env->spsr;
    iVar2 = bank_number(mode);
    env->regs[0xd] = env->banked_r13[iVar2];
    env->spsr = (uint32_t)env->banked_spsr[iVar2];
    uVar1 = env->regs[0xe];
    iVar2 = r14_bank_number(mode_00);
    env->banked_r14[iVar2] = uVar1;
    iVar2 = r14_bank_number(mode);
    env->regs[0xe] = env->banked_r14[iVar2];
  }
  return;
}

Assistant:

static void switch_mode(CPUARMState *env, int mode)
{
    int old_mode;
    int i;

    old_mode = env->uncached_cpsr & CPSR_M;
    if (mode == old_mode)
        return;

    if (old_mode == ARM_CPU_MODE_FIQ) {
        memcpy (env->fiq_regs, env->regs + 8, 5 * sizeof(uint32_t));
        memcpy (env->regs + 8, env->usr_regs, 5 * sizeof(uint32_t));
    } else if (mode == ARM_CPU_MODE_FIQ) {
        memcpy (env->usr_regs, env->regs + 8, 5 * sizeof(uint32_t));
        memcpy (env->regs + 8, env->fiq_regs, 5 * sizeof(uint32_t));
    }

    i = bank_number(old_mode);
    env->banked_r13[i] = env->regs[13];
    env->banked_spsr[i] = env->spsr;

    i = bank_number(mode);
    env->regs[13] = env->banked_r13[i];
    env->spsr = env->banked_spsr[i];

    env->banked_r14[r14_bank_number(old_mode)] = env->regs[14];
    env->regs[14] = env->banked_r14[r14_bank_number(mode)];
}